

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

event_change *
event_changelist_get_or_construct
          (event_changelist *changelist,int fd,short old_events,event_changelist_fdinfo *fdinfo)

{
  int iVar1;
  long lVar2;
  event_change *peVar3;
  int iVar4;
  ulong uVar5;
  
  lVar2 = (long)fdinfo->idxplus1;
  if (lVar2 == 0) {
    iVar1 = changelist->changes_size;
    if (changelist->n_changes <= iVar1) {
      if (changelist->n_changes == iVar1) {
        uVar5 = 0x40;
        if (0x3f < iVar1) {
          uVar5 = (ulong)(uint)(iVar1 * 2);
        }
        peVar3 = (event_change *)event_mm_realloc_(changelist->changes,uVar5 * 0xc);
        if (peVar3 == (event_change *)0x0) {
          return (event_change *)0x0;
        }
        changelist->changes = peVar3;
        changelist->changes_size = (int)uVar5;
      }
      iVar1 = changelist->n_changes;
      iVar4 = iVar1 + 1;
      changelist->n_changes = iVar4;
      peVar3 = changelist->changes + iVar1;
      fdinfo->idxplus1 = iVar4;
      peVar3->fd = 0;
      peVar3->old_events = 0;
      peVar3->read_change = '\0';
      peVar3->write_change = '\0';
      *(undefined4 *)&peVar3->close_change = 0;
      peVar3->fd = fd;
      peVar3->old_events = old_events;
      return peVar3;
    }
  }
  else {
    if (changelist->changes[lVar2 + -1].fd == fd) {
      return changelist->changes + lVar2 + -1;
    }
    event_changelist_get_or_construct_cold_1();
  }
  event_changelist_get_or_construct_cold_2();
  return (event_change *)0x0;
}

Assistant:

static struct event_change *
event_changelist_get_or_construct(struct event_changelist *changelist,
    evutil_socket_t fd,
    short old_events,
    struct event_changelist_fdinfo *fdinfo)
{
	struct event_change *change;

	if (fdinfo->idxplus1 == 0) {
		int idx;
		EVUTIL_ASSERT(changelist->n_changes <= changelist->changes_size);

		if (changelist->n_changes == changelist->changes_size) {
			if (event_changelist_grow(changelist) < 0)
				return NULL;
		}

		idx = changelist->n_changes++;
		change = &changelist->changes[idx];
		fdinfo->idxplus1 = idx + 1;

		memset(change, 0, sizeof(struct event_change));
		change->fd = fd;
		change->old_events = old_events;
	} else {
		change = &changelist->changes[fdinfo->idxplus1 - 1];
		EVUTIL_ASSERT(change->fd == fd);
	}
	return change;
}